

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

void __thiscall Node::GetOutBk(Node *this)

{
  Block *this_00;
  bool bVar1;
  network_address_t nVar2;
  Network *pNVar3;
  ostream *poVar4;
  BlockAddressed bka;
  undefined1 local_290 [8];
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  _Alloc_hider local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  int64_t local_228;
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  time_t local_200;
  uint32_t local_1f8;
  undefined1 local_1f0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  int64_t local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  time_t local_160;
  uint32_t local_158;
  Block local_150;
  Block local_b8;
  
  this_00 = (Block *)(local_1f0 + 8);
  Block::Block(this_00);
  pNVar3 = Network::instance();
  bVar1 = Network::List_Blocks(pNVar3);
  if (bVar1) {
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_3a62f,0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  }
  else {
    pNVar3 = Network::instance();
    nVar2 = NetworkNode::GetNodeAddress(&this->super_NetworkNode);
    Network::RecvBlock((BlockAddressed *)local_290,pNVar3,nVar2);
    local_1f0._0_8_ = local_290;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_288);
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_268);
    std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_248);
    local_188 = local_228;
    std::__cxx11::string::operator=((string *)local_180,(string *)&local_220);
    local_160 = local_200;
    local_158 = local_1f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_p != &local_210) {
      operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_p != &local_238) {
      operator_delete(local_248._M_p,local_238._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != &local_258) {
      operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_p != &local_278) {
      operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
    }
    Block::Block(&local_150,this_00);
    Blockchain::AddBlock(&local_b8,&this->bChain,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._bData._M_dataplus._M_p != &local_b8._bData.field_2) {
      operator_delete(local_b8._bData._M_dataplus._M_p,
                      local_b8._bData.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.merkle_root._M_dataplus._M_p != &local_b8.merkle_root.field_2) {
      operator_delete(local_b8.merkle_root._M_dataplus._M_p,
                      local_b8.merkle_root.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._bHash._M_dataplus._M_p != &local_b8._bHash.field_2) {
      operator_delete(local_b8._bHash._M_dataplus._M_p,
                      local_b8._bHash.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.bPrevHash._M_dataplus._M_p != &local_b8.bPrevHash.field_2) {
      operator_delete(local_b8.bPrevHash._M_dataplus._M_p,
                      local_b8.bPrevHash.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._bData._M_dataplus._M_p != &local_150._bData.field_2) {
      operator_delete(local_150._bData._M_dataplus._M_p,
                      local_150._bData.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.merkle_root._M_dataplus._M_p != &local_150.merkle_root.field_2) {
      operator_delete(local_150.merkle_root._M_dataplus._M_p,
                      local_150.merkle_root.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._bHash._M_dataplus._M_p != &local_150._bHash.field_2) {
      operator_delete(local_150._bHash._M_dataplus._M_p,
                      local_150._bHash.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.bPrevHash._M_dataplus._M_p != &local_150.bPrevHash.field_2) {
      operator_delete(local_150.bPrevHash._M_dataplus._M_p,
                      local_150.bPrevHash.field_2._M_allocated_capacity + 1);
    }
    nVar2 = NetworkNode::GetNodeAddress(&this->super_NetworkNode);
    if (nVar2 != 3) goto LAB_00107b76;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_3a5b3,9)
    ;
    nVar2 = NetworkNode::GetNodeAddress(&this->super_NetworkNode);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,nVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,anon_var_dwarf_3a603,0xb);
    Block::GetBIndex(this_00);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,anon_var_dwarf_3a619,0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  std::ostream::put((char)poVar4);
  std::ostream::flush();
LAB_00107b76:
  if (local_180[0] != &local_170) {
    operator_delete(local_180[0],local_170._M_allocated_capacity + 1);
  }
  if (local_1a8[0] != &local_198) {
    operator_delete(local_1a8[0],local_198._M_allocated_capacity + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1f0._8_8_ != local_1f0 + 0x18) {
    operator_delete((void *)local_1f0._8_8_,local_1f0._24_8_ + 1);
  }
  return;
}

Assistant:

void Node::GetOutBk() {
  BlockAddressed bka;
  if (!Network::instance().List_Blocks())
  {
     bka = Network::instance().RecvBlock(GetNodeAdd());
     bChain.AddBlock(bka.bk);
     if (GetNodeAdd() == 3)
      std::cout << "节点：" << GetNodeAdd() <<" 添加第 "<< bka.bk.GetBIndex() <<" 个区块. "<< std::endl;
    //std::cout << "Merkle_root:" << bka.bk.GetMerkleRoot()<<std::endl;
  }
  else
    std::cout << "区块列表为空！"<<std::endl;
}